

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verification_utils.hpp
# Opt level: O0

void __thiscall boost::certify::store_ctx::set_server_hostname(store_ctx *this,string_view hostname)

{
  error_code ec_00;
  bool bVar1;
  X509_STORE_CTX *ctx;
  error_code *in_R8;
  string_view hostname_00;
  system_error local_88;
  X509_VERIFY_PARAM *local_48;
  char *local_40;
  undefined1 auStack_38 [8];
  error_code ec;
  X509_VERIFY_PARAM *param;
  store_ctx *this_local;
  string_view hostname_local;
  
  hostname_00.ptr_ = (char *)hostname.len_;
  ctx = (X509_STORE_CTX *)
        std::unique_ptr<x509_store_ctx_st,_boost::certify::store_ctx::free>::get(&this->handle_);
  ec.cat_ = (error_category *)X509_STORE_CTX_get0_param(ctx);
  system::error_code::error_code((error_code *)auStack_38);
  hostname_00.len_ = (size_t)auStack_38;
  local_48 = (X509_VERIFY_PARAM *)hostname.ptr_;
  local_40 = hostname_00.ptr_;
  detail::set_server_hostname
            ((detail *)ec.cat_,(X509_VERIFY_PARAM *)hostname.ptr_,hostname_00,in_R8);
  bVar1 = system::error_code::operator_cast_to_bool((error_code *)auStack_38);
  if (!bVar1) {
    return;
  }
  ec_00.cat_ = (error_category *)ec._0_8_;
  ec_00.val_ = auStack_38._0_4_;
  ec_00.failed_ = (bool)auStack_38[4];
  ec_00._5_3_ = auStack_38._5_3_;
  system::system_error::system_error(&local_88,ec_00);
  throw_exception<boost::system::system_error>(&local_88);
}

Assistant:

void set_server_hostname(string_view hostname)
    {
        auto* param = ::X509_STORE_CTX_get0_param(handle_.get());
        system::error_code ec;
        detail::set_server_hostname(param, hostname, ec);
        if (ec)
            boost::throw_exception(system::system_error{ec});
    }